

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadOperator
              (char *text,
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              *op,bool *need_value,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  value_type_conflict2 vVar1;
  ErrorType *pEVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  char *val;
  reference pvVar8;
  bool bVar9;
  Instruction local_148;
  Instruction local_138;
  Instruction local_128;
  int local_114;
  undefined1 local_110 [4];
  int line_jt;
  int local_fc;
  int local_f8;
  int line_je;
  int tmp_3;
  int i_3;
  undefined4 local_dc;
  string local_d8 [8];
  string name;
  uint tmp_2;
  int i_2;
  int local_a0;
  int local_9c;
  int tmp_1;
  int i_1;
  Instruction local_88;
  Instruction local_78;
  byte local_61;
  uint local_60;
  int iStack_5c;
  bool need_arg;
  anon_union_4_2_7f9ed04a tmp;
  int index;
  int i;
  Instruction local_48;
  ErrorType *local_38;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  bool *need_value_local;
  vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_> *op_local;
  char *text_local;
  
  *need_value = true;
  local_38 = errorType;
  errorType_local = (ErrorType *)instrl;
  instrl_local = (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                 need_value;
  need_value_local = (bool *)op;
  op_local = (vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              *)text;
  if (*text == '(') {
    while( true ) {
      sVar5 = std::
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              ::size((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                      *)need_value_local);
      bVar9 = false;
      if (sVar5 != 0) {
        pvVar6 = std::
                 vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                 ::back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                         *)need_value_local);
        pvVar7 = std::array<unsigned_char,_35UL>::operator[]
                           ((array<unsigned_char,_35UL> *)OP_Priority,(ulong)*pvVar6);
        bVar9 = *pvVar7 == '\x01';
      }
      pEVar2 = errorType_local;
      if (!bVar9) break;
      PopOperator((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                   *)need_value_local,
                  (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                  errorType_local);
    }
    Instruction::Instruction(&local_48,INSTR_PUSH_ARGS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)pEVar2,
               &local_48);
    Instruction::~Instruction(&local_48);
    tmp.i = 1;
    iStack_5c = 0;
    local_61 = 1;
    while (*(char *)((long)&(op_local->
                            super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                            )._M_impl.super__Vector_impl_data._M_start + (long)tmp.i) != ')') {
      local_60 = ReadWhitespace((char *)((long)&(op_local->
                                                super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                        (long)tmp.i));
      if (local_60 == 0) {
        if (((local_61 & 1) == 0) ||
           (local_60 = ReadExpression((char *)((long)&(op_local->
                                                                                                            
                                                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                              (long)tmp.i),
                                      (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                       *)errorType_local,local_38), pEVar2 = errorType_local,
           iVar4 = iStack_5c, (int)local_60 < 1)) {
          if ((int)local_60 < 0) {
            return local_60 - tmp.i;
          }
          if (((local_61 & 1) != 0) ||
             (*(char *)((long)&(op_local->
                               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                               )._M_impl.super__Vector_impl_data._M_start + (long)tmp.i) != ',')) {
            *local_38 = SCRPT_ERROR_PARENTHESIS_CLOSE;
            return -tmp.i;
          }
          tmp.i = tmp.i + 1;
          local_61 = 1;
        }
        else {
          tmp.i = tmp.i + local_60;
          local_61 = 0;
          iStack_5c = iStack_5c + 1;
          Instruction::Instruction(&local_78,INSTR_DEFINE_ARG,iVar4);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                     pEVar2,&local_78);
          Instruction::~Instruction(&local_78);
        }
      }
      else {
        tmp.i = local_60 + tmp.i;
      }
    }
    if (((local_61 & 1) == 0) || (iStack_5c < 1)) {
      sVar5 = std::
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              ::size((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                      *)need_value_local);
      if ((sVar5 == 0) ||
         (pvVar6 = std::
                   vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                   ::back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                           *)need_value_local), *pvVar6 != OP_NEW)) {
        pEVar2 = errorType_local;
        Instruction::Instruction((Instruction *)&tmp_1,INSTR_OP_CALL);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                  ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                   pEVar2,(Instruction *)&tmp_1);
        Instruction::~Instruction((Instruction *)&tmp_1);
      }
      else {
        std::vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>::
        pop_back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  *)need_value_local);
        pEVar2 = errorType_local;
        Instruction::Instruction(&local_88,INSTR_VALUE_OBJECT);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                  ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                   pEVar2,&local_88);
        Instruction::~Instruction(&local_88);
      }
      *(undefined1 *)
       &(instrl_local->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0;
      text_local._4_4_ = tmp.i + 1;
    }
    else {
      *local_38 = SCRPT_ERROR_EXPRESSION;
      text_local._4_4_ = -tmp.i;
    }
  }
  else if (*text == '[') {
    while( true ) {
      sVar5 = std::
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              ::size((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                      *)need_value_local);
      bVar9 = false;
      if (sVar5 != 0) {
        pvVar6 = std::
                 vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                 ::back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                         *)need_value_local);
        pvVar7 = std::array<unsigned_char,_35UL>::operator[]
                           ((array<unsigned_char,_35UL> *)OP_Priority,(ulong)*pvVar6);
        bVar9 = *pvVar7 == '\x01';
      }
      if (!bVar9) break;
      PopOperator((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                   *)need_value_local,
                  (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                  errorType_local);
    }
    local_9c = 1;
    uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
    local_9c = uVar3 + local_9c;
    local_a0 = ReadExpression((char *)((long)&(op_local->
                                              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                              )._M_impl.super__Vector_impl_data._M_start +
                                      (long)local_9c),
                              (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType_local,local_38);
    if (local_a0 < 1) {
      if (local_a0 == 0) {
        *local_38 = SCRPT_ERROR_EXPRESSION;
        text_local._4_4_ = -local_9c;
      }
      else {
        text_local._4_4_ = local_a0 - local_9c;
      }
    }
    else {
      local_9c = local_a0 + local_9c;
      uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                             super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                             )._M_impl.super__Vector_impl_data._M_start +
                                     (long)local_9c));
      pEVar2 = errorType_local;
      local_9c = uVar3 + local_9c;
      if (*(char *)((long)&(op_local->
                           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)local_9c) == ']') {
        Instruction::Instruction((Instruction *)&tmp_2,INSTR_OP_ARRAY);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                  ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                   pEVar2,(Instruction *)&tmp_2);
        Instruction::~Instruction((Instruction *)&tmp_2);
        *(undefined1 *)
         &(instrl_local->
          super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
          _M_impl.super__Vector_impl_data._M_start = 0;
        text_local._4_4_ = local_9c + 1;
      }
      else {
        *local_38 = SCRPT_ERROR_BRACKET_CLOSE;
        text_local._4_4_ = -local_9c;
      }
    }
  }
  else if (*text == '.') {
    while( true ) {
      sVar5 = std::
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              ::size((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                      *)need_value_local);
      bVar9 = false;
      if (sVar5 != 0) {
        pvVar6 = std::
                 vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                 ::back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                         *)need_value_local);
        pvVar7 = std::array<unsigned_char,_35UL>::operator[]
                           ((array<unsigned_char,_35UL> *)OP_Priority,(ulong)*pvVar6);
        bVar9 = *pvVar7 == '\x01';
      }
      if (!bVar9) break;
      PopOperator((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                   *)need_value_local,
                  (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                  errorType_local);
    }
    uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
    iVar4 = uVar3 + 1;
    std::__cxx11::string::string(local_d8);
    uVar3 = ReadName((char *)((long)&(op_local->
                                     super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                     )._M_impl.super__Vector_impl_data._M_start + (long)iVar4),
                     (string *)local_d8);
    pEVar2 = errorType_local;
    if (uVar3 == 0) {
      *local_38 = SCRPT_ERROR_NAME;
      text_local._4_4_ = -iVar4;
    }
    else {
      val = (char *)std::__cxx11::string::c_str();
      Instruction::Instruction((Instruction *)&tmp_3,INSTR_OP_MEMBER,val);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)pEVar2
                 ,(value_type *)&tmp_3);
      Instruction::~Instruction((Instruction *)&tmp_3);
      *(undefined1 *)
       &(instrl_local->
        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
        _M_impl.super__Vector_impl_data._M_start = 0;
      text_local._4_4_ = iVar4 + uVar3;
    }
    local_dc = 1;
    std::__cxx11::string::~string(local_d8);
  }
  else if (*text == '?') {
    while( true ) {
      sVar5 = std::
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              ::size((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                      *)need_value_local);
      bVar9 = false;
      if (sVar5 != 0) {
        pvVar6 = std::
                 vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                 ::back((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                         *)need_value_local);
        pvVar7 = std::array<unsigned_char,_35UL>::operator[]
                           ((array<unsigned_char,_35UL> *)OP_Priority,(ulong)*pvVar6);
        vVar1 = *pvVar7;
        pvVar7 = std::array<unsigned_char,_35UL>::operator[]
                           ((array<unsigned_char,_35UL> *)OP_Priority,0x1e);
        bVar9 = vVar1 == *pvVar7;
      }
      if (!bVar9) break;
      PopOperator((vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                   *)need_value_local,
                  (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                  errorType_local);
    }
    line_je = 1;
    sVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                      ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                       errorType_local);
    local_fc = (int)sVar5;
    uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                   (long)line_je));
    pEVar2 = errorType_local;
    line_je = line_je + uVar3;
    Instruction::Instruction((Instruction *)local_110,INSTR_JUMP_ELSE);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)pEVar2,
               (Instruction *)local_110);
    Instruction::~Instruction((Instruction *)local_110);
    local_f8 = ReadExpression((char *)((long)&(op_local->
                                              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                              )._M_impl.super__Vector_impl_data._M_start +
                                      (long)line_je),
                              (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType_local,local_38);
    if (local_f8 < 1) {
      if (local_f8 == 0) {
        *local_38 = SCRPT_ERROR_EXPRESSION;
        text_local._4_4_ = -line_je;
      }
      else {
        text_local._4_4_ = local_f8 - line_je;
      }
    }
    else {
      line_je = line_je + local_f8;
      uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                             super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                             )._M_impl.super__Vector_impl_data._M_start +
                                     (long)line_je));
      line_je = line_je + uVar3;
      sVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                          *)errorType_local);
      pEVar2 = errorType_local;
      local_114 = (int)sVar5;
      Instruction::Instruction(&local_128,INSTR_JUMP_TO);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)pEVar2
                 ,&local_128);
      Instruction::~Instruction(&local_128);
      sVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        ((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                          *)errorType_local);
      Instruction::Instruction(&local_138,INSTR_JUMP_ELSE,(int)sVar5);
      pvVar8 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
               operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           *)errorType_local,(long)local_fc);
      Instruction::operator=(pvVar8,&local_138);
      Instruction::~Instruction(&local_138);
      if (*(char *)((long)&(op_local->
                           super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)line_je) == ':') {
        uVar3 = ReadWhitespace((char *)((long)&(op_local->
                                               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                               )._M_impl.super__Vector_impl_data._M_start +
                                       (long)line_je));
        line_je = uVar3 + line_je;
        local_f8 = ReadExpression((char *)((long)&(op_local->
                                                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          (long)line_je),
                                  (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                   *)errorType_local,local_38);
        if (local_f8 < 1) {
          if (local_f8 == 0) {
            *local_38 = SCRPT_ERROR_EXPRESSION;
            text_local._4_4_ = -line_je;
          }
          else {
            text_local._4_4_ = local_f8 - line_je;
          }
        }
        else {
          sVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  size((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *)
                       errorType_local);
          Instruction::Instruction(&local_148,INSTR_JUMP_TO,(int)sVar5);
          pvVar8 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                   operator[]((vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType_local,(long)local_114);
          Instruction::operator=(pvVar8,&local_148);
          Instruction::~Instruction(&local_148);
          text_local._4_4_ = local_f8 + line_je;
        }
      }
      else {
        *local_38 = SCRPT_ERROR_COLON;
        text_local._4_4_ = -line_je;
      }
    }
  }
  else {
    switch(*text) {
    case '!':
      if (text[1] == '=') {
        PushOperator(op,OP_DIF,instrl);
        text_local._4_4_ = 2;
      }
      else {
        *errorType = SCRPT_ERROR_OPERATOR;
        text_local._4_4_ = -1;
      }
      break;
    default:
      *need_value = false;
      text_local._4_4_ = 0;
      break;
    case '%':
      PushOperator(op,OP_MOD,instrl);
      text_local._4_4_ = 1;
      break;
    case '&':
      if (text[1] == '&') {
        PushOperator(op,OP_AND,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_BIT_AND,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '*':
      if (text[1] == '=') {
        PushOperator(op,OP_MUL_ASSIGN,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_MUL,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '+':
      if (text[1] == '=') {
        PushOperator(op,OP_ADD_ASSIGN,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_ADD,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '-':
      if (text[1] == '=') {
        PushOperator(op,OP_SUB_ASSIGN,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_SUB,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '/':
      if (text[1] == '=') {
        PushOperator(op,OP_DIV_ASSIGN,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_DIV,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '<':
      if (text[1] == '=') {
        PushOperator(op,OP_LESS_EQU,instrl);
        text_local._4_4_ = 2;
      }
      else if (text[1] == '<') {
        PushOperator(op,OP_LSHIFT,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_LESS,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '=':
      if (text[1] == '=') {
        PushOperator(op,OP_EQU,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_ASSIGN,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '>':
      if (text[1] == '=') {
        PushOperator(op,OP_GREAT_EQU,instrl);
        text_local._4_4_ = 2;
      }
      else if (text[1] == '>') {
        PushOperator(op,OP_RSHIFT,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_GREAT,instrl);
        text_local._4_4_ = 1;
      }
      break;
    case '^':
      PushOperator(op,OP_BIT_XOR,instrl);
      text_local._4_4_ = 1;
      break;
    case '|':
      if (text[1] == '|') {
        PushOperator(op,OP_OR,instrl);
        text_local._4_4_ = 2;
      }
      else {
        PushOperator(op,OP_BIT_OR,instrl);
        text_local._4_4_ = 1;
      }
    }
  }
  return text_local._4_4_;
}

Assistant:

int LiteScript::Syntax::ReadOperator(const char *text, std::vector<Operators> &op, bool& need_value, std::vector<Instruction> &instrl,
                                     Script::ErrorType &errorType) {
    need_value = true;
    if (text[0] == '(') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        instrl.push_back(Instruction(InstrCode::INSTR_PUSH_ARGS));
        int i = 1, index = 0;
        union {
            int i;
            unsigned int ui;
        } tmp;
        bool need_arg = true;
        while (text[i] != ')') {
            if ((tmp.ui = ReadWhitespace(text + i)) > 0)
                i += (int)tmp.ui;
            else if (need_arg && (tmp.i = ReadExpression(text + i, instrl, errorType)) > 0) {
                i += tmp.i;
                need_arg = false;
                instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_ARG, index++));
            }
            else if (tmp.i < 0)
                return tmp.i - i;
            else if (!need_arg && text[i] == ',') {
                i++;
                need_arg = true;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
                return -i;
            }
        }
        if (need_arg && index > 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
        if (op.size() > 0 && op.back() == Operators::OP_NEW) {
            op.pop_back();
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
        }
        else
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '[') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1, tmp;
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ']') {
            errorType = Script::ErrorType::SCRPT_ERROR_BRACKET_CLOSE;
            return -i;
        }
        instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '.') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1;
        i += (int)ReadWhitespace(text + i);
        unsigned int tmp;
        std::string name;
        if ((tmp = ReadName(text + i, name)) == 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_NAME;
            return -i;
        }
        i += (int)tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_OP_MEMBER, name.c_str()));
        need_value = false;
        return i;
    }
    else if (text[0] == '?') {
        while (op.size() > 0 && OP_Priority[op.back()] == OP_Priority[Operators::OP_ASSIGN])
            PopOperator(op, instrl);
        int i = 1, tmp, line_je = instrl.size();
        i += (int)ReadWhitespace(text + i);
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        int line_jt = instrl.size();
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
        instrl[line_je] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
        if (text[i] != ':') {
            errorType = Script::ErrorType::SCRPT_ERROR_COLON;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        instrl[line_jt] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
        i += tmp;
        return i;
    }
    else {
        switch (text[0]) {
            case '+':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_ADD_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ADD, instrl);
                    return 1;
                }
            case '-':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_SUB_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_SUB, instrl);
                    return 1;
                }
            case '*':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_MUL_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_MUL, instrl);
                    return 1;
                }
            case '/':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIV_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_DIV, instrl);
                    return 1;
                }
            case '%':
                PushOperator(op, Operators::OP_MOD, instrl);
                return 1;
            case '=':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_EQU, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ASSIGN, instrl);
                    return 1;
                }
            case '!':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIF, instrl);
                    return 2;
                }
                else {
                    errorType = Script::ErrorType::SCRPT_ERROR_OPERATOR;
                    return -1;
                }
            case '<':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_LESS_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '<') {
                    PushOperator(op, Operators::OP_LSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_LESS, instrl);
                    return 1;
                }
            case '>':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_GREAT_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '>') {
                    PushOperator(op, Operators::OP_RSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_GREAT, instrl);
                    return 1;
                }
            case '&':
                if (text[1] == '&') {
                    PushOperator(op, Operators::OP_AND, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_AND, instrl);
                    return 1;
                }
            case '|':
                if (text[1] == '|') {
                    PushOperator(op, Operators::OP_OR, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_OR, instrl);
                    return 1;
                }
            case '^':
                PushOperator(op, Operators::OP_BIT_XOR, instrl);
                return 1;
            default:
                need_value = false;
                return 0;
        }
    }
}